

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O2

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _c;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  int sw;
  long lVar10;
  undefined4 *puVar11;
  long lVar12;
  long lVar13;
  int local_d0;
  Mat m;
  Mat local_70;
  
  iVar6 = bottom_blob->w;
  uVar1 = bottom_blob->h;
  iVar4 = this->upscale_factor;
  _c = bottom_blob->c / (iVar4 * iVar4);
  Mat::create(top_blob,iVar4 * iVar6,iVar4 * uVar1,_c,bottom_blob->elemsize,opt->blob_allocator);
  local_d0 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    local_d0 = 0;
    if (_c < 1) {
      _c = 0;
    }
    for (iVar4 = 0; iVar4 != _c; iVar4 = iVar4 + 1) {
      Mat::channel(&m,top_blob,iVar4);
      uVar3 = (ulong)(uint)this->upscale_factor;
      for (lVar12 = 0; lVar12 < (int)uVar3; lVar12 = lVar12 + 1) {
        lVar13 = 0;
        lVar10 = 0;
        while( true ) {
          iVar2 = (int)uVar3;
          if (iVar2 <= lVar10) break;
          Mat::channel(&local_70,bottom_blob,(int)lVar10 + (iVar2 * iVar4 + (int)lVar12) * iVar2);
          puVar11 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          uVar3 = (ulong)this->upscale_factor;
          puVar5 = (undefined4 *)((long)m.w * m.elemsize * lVar12 + lVar13 + (long)m.data);
          for (uVar8 = 0; puVar9 = puVar5, iVar2 = iVar6, uVar8 != uVar7; uVar8 = uVar8 + 1) {
            while (iVar2 != 0) {
              *puVar9 = *puVar11;
              puVar11 = puVar11 + 1;
              puVar9 = puVar9 + uVar3;
              iVar2 = iVar2 + -1;
            }
            puVar5 = (undefined4 *)((long)puVar5 + (long)m.w * m.elemsize * uVar3);
          }
          lVar10 = lVar10 + 1;
          lVar13 = lVar13 + 4;
        }
      }
      Mat::~Mat(&m);
    }
  }
  return local_d0;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                const float* sptr = bottom_blob.channel(p*upscale_factor*upscale_factor + sh*upscale_factor + sw);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i*upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}